

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  TPZVec<long> *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  TPZGenMatrix<int> *in_RCX;
  int in_EDX;
  TPZVec<long> *in_RSI;
  int in_EDI;
  size_t in_stack_00000128;
  char *in_stack_00000130;
  int soma;
  int k;
  int j;
  int i_1;
  int ord;
  int count;
  int nshape_3;
  int i;
  int totsum;
  int il_1;
  TPZGenMatrix<int> locshapeorders_1;
  int node_1;
  TPZManVector<long,_4> locid_1;
  int nnodes_1;
  TPZStack<int,_10> lowersides_1;
  int nshape_2;
  int il;
  TPZGenMatrix<int> locshapeorders;
  int nshape_1;
  int node;
  TPZManVector<long,_4> locid;
  int nnodes;
  TPZStack<int,_10> lowersides;
  int ioy;
  int nshape;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  int in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  TPZStack<int,_10> *in_stack_fffffffffffffd20;
  TPZGenMatrix<int> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  TPZVec<long> *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined8 in_stack_fffffffffffffd50;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_17c;
  TPZVec<long> local_178 [2];
  int local_134;
  int local_e8;
  int local_e4;
  int local_c8;
  int local_c4;
  TPZVec<long> local_c0 [2];
  int local_80;
  int local_28;
  int local_24;
  int local_14;
  TPZVec<long> *local_10;
  int local_4;
  
  if (in_EDI < 5) {
    iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
    if (iVar5 != 1) {
      pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
    }
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    *piVar6 = 1;
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    *piVar6 = 0;
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    *piVar6 = 0;
  }
  else {
    local_14 = in_EDX;
    if ((in_EDI < 5) || (0xc < in_EDI)) {
      local_10 = in_RSI;
      local_4 = in_EDI;
      if (in_EDI == 0xd) {
        iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar5 != (local_14 + -1) * (local_14 + -1)) {
          pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
        }
        TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd20);
        pztopology::TPZPyramid::LowerDimensionSides
                  ((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                   (TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd0c);
        local_80 = pztopology::TPZPyramid::NSideNodes(local_4);
        TPZManVector<long,_4>::TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (int64_t)in_stack_fffffffffffffd28);
        local_c4 = 0;
        while( true ) {
          lVar7 = (long)local_c4;
          iVar5 = TPZVec<long>::size(local_c0);
          pTVar1 = local_10;
          iVar3 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
          iVar2 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
          if (iVar5 <= lVar7) break;
          iVar2 = pztopology::TPZPyramid::ContainedSideLocId
                            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
          plVar8 = TPZVec<long>::operator[](pTVar1,(long)iVar2);
          lVar7 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_c0,(long)local_c4);
          *plVar8 = lVar7;
          local_c4 = local_c4 + 1;
        }
        local_c8 = (local_14 + -1) * (local_14 + -1);
        TPZGenMatrix<int>::TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (int64_t)in_stack_fffffffffffffd28,(int64_t)in_stack_fffffffffffffd20);
        TPZShapeQuad::SideShapeOrder
                  (iVar3,(TPZVec<long> *)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),iVar2,
                   (TPZGenMatrix<int> *)in_stack_fffffffffffffd38);
        for (local_e4 = 0; local_e4 < local_c8; local_e4 = local_e4 + 1) {
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar2;
        }
        TPZGenMatrix<int>::~TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        TPZManVector<long,_4>::~TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1884645);
      }
      else if ((in_EDI < 0xe) || (0x11 < in_EDI)) {
        local_1a0 = 0;
        for (local_1a4 = 0; local_1a4 < in_EDX + -2; local_1a4 = local_1a4 + 1) {
          local_1a0 = ((local_1a4 + 1) * (local_1a4 + 2)) / 2 + local_1a0;
        }
        iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar5 != local_1a0) {
          pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
        }
        iVar2 = local_14 + -2;
        for (local_1b4 = 0; local_1b4 < iVar2; local_1b4 = local_1b4 + 1) {
          for (local_1b8 = 0; local_1b8 < iVar2; local_1b8 = local_1b8 + 1) {
            for (local_1bc = 0; local_1bc < iVar2; local_1bc = local_1bc + 1) {
              iVar3 = local_1b4 + local_1b8 + local_1bc;
              if (local_1b4 + local_1b8 + local_1bc < iVar2) {
                iVar4 = iVar3 + 3;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                    CONCAT44(in_stack_fffffffffffffd14,iVar4),
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
                *piVar6 = iVar4;
                in_stack_fffffffffffffd14 = iVar3 + 3;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                    CONCAT44(in_stack_fffffffffffffd14,iVar4),
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
                *piVar6 = in_stack_fffffffffffffd14;
                in_stack_fffffffffffffd18 = iVar3 + 3;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                    CONCAT44(in_stack_fffffffffffffd14,iVar4),
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
                *piVar6 = in_stack_fffffffffffffd18;
              }
            }
          }
        }
      }
      else {
        local_e8 = ((in_EDX + -2) * (in_EDX + -1)) / 2;
        iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar5 != local_e8) {
          pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
        }
        TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd20);
        pztopology::TPZPyramid::LowerDimensionSides
                  ((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                   (TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd0c);
        local_134 = pztopology::TPZPyramid::NSideNodes(local_4);
        TPZManVector<long,_4>::TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (int64_t)in_stack_fffffffffffffd28);
        local_17c = 0;
        while( true ) {
          iVar5 = TPZVec<long>::size(local_178);
          pTVar1 = local_10;
          iVar2 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
          if (iVar5 <= local_17c) break;
          iVar2 = pztopology::TPZPyramid::ContainedSideLocId
                            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
          plVar8 = TPZVec<long>::operator[](pTVar1,(long)iVar2);
          lVar7 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_178,(long)local_17c);
          *plVar8 = lVar7;
          local_17c = local_17c + 1;
        }
        TPZGenMatrix<int>::TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (int64_t)in_stack_fffffffffffffd28,(int64_t)in_stack_fffffffffffffd20);
        TPZShapeTriang::SideShapeOrder
                  (iVar2,in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                   in_stack_fffffffffffffd28);
        for (local_19c = 0; local_19c < local_e8; local_19c = local_19c + 1) {
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          in_stack_fffffffffffffd1c = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          *piVar6 = in_stack_fffffffffffffd1c;
        }
        TPZGenMatrix<int>::~TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        TPZManVector<long,_4>::~TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1884a1c);
      }
    }
    else {
      local_24 = in_EDX + -1;
      iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar5 != local_24) {
        pzinternal::DebugStopImpl(in_stack_00000130,in_stack_00000128);
      }
      for (local_28 = 0; local_28 < local_14 + -1; local_28 = local_28 + 1) {
        iVar2 = local_28 + 2;
        piVar6 = TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        *piVar6 = iVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZShapePiram::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=4)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=5 && side<=12)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 13)
        {
            // quadrilatero
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else if (side >= 14 && side <= 17)
        {
            //triangulos
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {
            // interno
            int totsum = 0;
            for(int i=0;i<order - 2;i++) {
                totsum += (i+1)*(i+2) / 2;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-2;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int soma = i+j+k;
                        if( i+j+k < ord ) // Duvida
                        {
                            shapeorders(count,0) = 3 + soma;
                            shapeorders(count,1) = 3 + soma;
                            shapeorders(count,2) = 3 + soma;
                            count++;
                        }
                    }
                }
            }
        }

    }